

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::yield()::YieldPromiseNode::get(kj::_::ExceptionOrValue__(void *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::_::Void> local_1a0;
  
  local_1a0.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1a0.value.ptr.isSet = true;
  kj::_::ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_1a0);
  if (local_1a0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1a0.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void get(_::ExceptionOrValue& output) noexcept override {
      output.as<_::Void>() = _::Void();
    }